

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

void __thiscall
ska::detailv3::sherwood_v3_table<$ed070bb7$>::clear(sherwood_v3_table<_ed070bb7_> *this)

{
  bool bVar1;
  EntryPointer psVar2;
  EntryPointer end;
  EntryPointer it;
  sherwood_v3_table<_ed070bb7_> *this_local;
  
  end = this->entries;
  psVar2 = end + this->num_slots_minus_one + (long)this->max_lookups;
  for (; end != psVar2; end = end + 1) {
    bVar1 = sherwood_v3_entry<std::pair<slang::DiagCode,_ska::flat_hash_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::Hasher<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>
            ::has_value(end);
    if (bVar1) {
      sherwood_v3_entry<std::pair<slang::DiagCode,_ska::flat_hash_map<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>,_slang::Hasher<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>_>_>
      ::destroy_value(end);
    }
  }
  this->num_elements = 0;
  return;
}

Assistant:

[[clang::reinitializes]]
    void clear()
    {
        for (EntryPointer it = entries, end = it + static_cast<ptrdiff_t>(num_slots_minus_one + max_lookups); it != end; ++it)
        {
            if (it->has_value())
                it->destroy_value();
        }
        num_elements = 0;
    }